

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_make_child_context(sexp ctx,sexp lambda)

{
  sexp psVar1;
  
  psVar1 = sexp_make_eval_context
                     (ctx,(ctx->value).type.name,(ctx->value).type.cpl,0,
                      ((ctx->value).context.heap)->max_size);
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    (((psVar1->value).opcode.methods)->value).type.getters = lambda;
    (((psVar1->value).type.name)->value).type.cpl = (((ctx->value).type.name)->value).type.cpl;
    (((psVar1->value).opcode.methods)->value).type.slots =
         (((ctx->value).opcode.methods)->value).type.slots;
    (psVar1->value).flonum_bits[0x60a1] = (ctx->value).flonum_bits[0x60a1];
  }
  return psVar1;
}

Assistant:

sexp sexp_make_child_context (sexp ctx, sexp lambda) {
  sexp res = sexp_make_eval_context(ctx,
                                    sexp_context_stack(ctx),
                                    sexp_context_env(ctx),
                                    0,
                                    sexp_context_max_size(ctx));
  if (! sexp_exceptionp(res)) {
    sexp_context_lambda(res) = lambda;
    sexp_context_top(res) = sexp_context_top(ctx);
    sexp_context_fv(res) = sexp_context_fv(ctx);
    sexp_context_tracep(res) = sexp_context_tracep(ctx);
  }
  return res;
}